

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.h
# Opt level: O0

void __thiscall
CTcHashEntryPpSpecial::CTcHashEntryPpSpecial
          (CTcHashEntryPpSpecial *this,CTcTokenizer *tok,char *str)

{
  char *in_RDX;
  CTcHashEntryPp *in_RSI;
  undefined8 *in_RDI;
  char *str_00;
  
  str_00 = in_RDX;
  strlen(in_RDX);
  CTcHashEntryPp::CTcHashEntryPp(in_RSI,str_00,(size_t)in_RDI,(int)((ulong)in_RDX >> 0x20));
  *in_RDI = &PTR__CTcHashEntryPpSpecial_0043f488;
  in_RDI[9] = in_RSI;
  return;
}

Assistant:

CTcHashEntryPpSpecial(CTcTokenizer *tok, const char *str)
        : CTcHashEntryPp(str, strlen(str), FALSE)
    {
        /* remember my tokenizer */
        tok_ = tok;
    }